

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

ParseNodeRegExp * __thiscall Parser::ParseRegExp<true>(Parser *this)

{
  BOOL BVar1;
  code *pcVar2;
  bool bVar3;
  ParseNodeType *pnode;
  RegexPattern *pRVar4;
  undefined4 *puVar5;
  
  Scanner<UTF8EncodingPolicyBase<false>_>::RescanRegExp(&this->m_scan);
  BVar1 = this->m_deferringAST;
  if (this->m_doingFastScan == true) {
    this->m_deferringAST = 0;
  }
  pnode = CreateNodeForOpT<(OpCode)7>(this);
  pRVar4 = Token::GetRegex((Token *)&this->m_token);
  pnode->regexPattern = pRVar4;
  if (this->m_doingFastScan == true) {
    this->m_deferringAST = BVar1;
    AddFastScannedRegExpNode(this,&pnode->super_ParseNode);
  }
  else if (this->m_isInBackground == true) {
    if (pRVar4 != (RegexPattern *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0xf03,"(pnode->regexPattern == nullptr)","pnode->regexPattern == nullptr")
      ;
      if (!bVar3) goto LAB_00e8536f;
      *puVar5 = 0;
    }
    AddBackgroundRegExpNode(this,&pnode->super_ParseNode);
  }
  if ((this->m_token).tk != tkRegExp) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0xf0c,"(m_token.tk == tkRegExp)","m_token.tk == tkRegExp");
    if (!bVar3) {
LAB_00e8536f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return pnode;
}

Assistant:

ParseNodeRegExp * Parser::ParseRegExp()
{
    ParseNodeRegExp * pnode = nullptr;

    if (buildAST || IsDoingFastScan())
    {
        this->GetScanner()->RescanRegExp();

#if ENABLE_BACKGROUND_PARSING
        BOOL saveDeferringAST = this->m_deferringAST;
        if (m_doingFastScan)
        {
            this->m_deferringAST = false;
        }
#endif
        pnode = CreateNodeForOpT<knopRegExp>();
        pnode->regexPattern = m_token.GetRegex();
#if ENABLE_BACKGROUND_PARSING
        if (m_doingFastScan)
        {
            this->m_deferringAST = saveDeferringAST;
            this->AddFastScannedRegExpNode(pnode);
            if (!buildAST)
            {
                pnode = nullptr;
            }
        }
        else if (this->IsBackgroundParser())
        {
            Assert(pnode->regexPattern == nullptr);
            this->AddBackgroundRegExpNode(pnode);
        }
#endif
    }
    else
    {
        this->GetScanner()->RescanRegExpNoAST();
    }
    Assert(m_token.tk == tkRegExp);

    return pnode;
}